

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void renameColumnIdlistNames(Parse *pParse,RenameCtx *pCtx,IdList *pIdList,char *zOld)

{
  int iVar1;
  char *zLeft;
  int iVar2;
  RenameToken *pToken;
  RenameToken *pRVar3;
  RenameToken *pRVar4;
  RenameToken **ppRVar5;
  long lVar6;
  
  if ((pIdList != (IdList *)0x0) && (iVar1 = pIdList->nId, 0 < (long)iVar1)) {
    lVar6 = 0;
    do {
      zLeft = pIdList->a[lVar6].zName;
      iVar2 = -(uint)(zOld != (char *)0x0);
      if (zLeft == (char *)0x0) {
LAB_0019c724:
        if ((iVar2 == 0) && (pRVar4 = pParse->pRename, pRVar4 != (RenameToken *)0x0)) {
          ppRVar5 = &pParse->pRename;
          if ((char *)pRVar4->p != zLeft) {
            do {
              pRVar3 = pRVar4;
              pRVar4 = pRVar3->pNext;
              if (pRVar4 == (RenameToken *)0x0) goto LAB_0019c76d;
            } while ((char *)pRVar4->p != zLeft);
            ppRVar5 = &pRVar3->pNext;
          }
          *ppRVar5 = pRVar4->pNext;
          pRVar4->pNext = pCtx->pList;
          pCtx->pList = pRVar4;
          pCtx->nList = pCtx->nList + 1;
        }
      }
      else if (zOld != (char *)0x0) {
        iVar2 = sqlite3StrICmp(zLeft,zOld);
        goto LAB_0019c724;
      }
LAB_0019c76d:
      lVar6 = lVar6 + 1;
    } while (lVar6 != iVar1);
  }
  return;
}

Assistant:

static void renameColumnIdlistNames(
  Parse *pParse, 
  RenameCtx *pCtx, 
  IdList *pIdList, 
  const char *zOld
){
  if( pIdList ){
    int i;
    for(i=0; i<pIdList->nId; i++){
      char *zName = pIdList->a[i].zName;
      if( 0==sqlite3_stricmp(zName, zOld) ){
        renameTokenFind(pParse, pCtx, (void*)zName);
      }
    }
  }
}